

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall QMenuBar::keyPressEvent(QMenuBar *this,QKeyEvent *e)

{
  QPointer<QAction> *this_00;
  byte bVar1;
  QMenuBarPrivate *this_01;
  Data *pDVar2;
  QAction *pQVar3;
  bool bVar4;
  char cVar5;
  char16_t cVar6;
  QChar QVar7;
  int iVar8;
  int iVar9;
  QStyle *pQVar10;
  QMenu *pQVar11;
  ulong uVar12;
  qsizetype qVar13;
  QChar *pQVar14;
  QAction *pQVar15;
  int i;
  QKeyEvent QVar16;
  QObject *pQVar17;
  QAction *pQVar18;
  long lVar19;
  QObject *action;
  long in_FS_OFFSET;
  int local_8c;
  QAction *local_88;
  QAction *local_80;
  QAction *local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QMenuBarPrivate **)&(this->super_QWidget).field_0x8;
  QMenuBarPrivate::updateGeometries(this_01);
  iVar9 = *(int *)(e + 0x40);
  bVar4 = QWidget::isRightToLeft(&this->super_QWidget);
  iVar8 = 1;
  if (bVar4) {
    switch(iVar9) {
    case 0x1000012:
      goto switchD_0042d797_caseD_1000012;
    case 0x1000013:
    case 0x1000015:
      goto switchD_0042d797_caseD_1000013;
    case 0x1000014:
      goto switchD_0042d797_caseD_1000014;
    default:
      if ((iVar9 + 0xfefffffcU < 2) || (iVar9 == 0x20)) goto switchD_0042d797_caseD_1000013;
      if (iVar9 == 0x1000001) goto switchD_0042d797_caseD_1000012;
      if (iVar9 == 0x1000002) goto switchD_0042d797_caseD_1000014;
      goto LAB_0042d895;
    }
  }
  switch(iVar9) {
  case 0x1000012:
  case 0x1000014:
    iVar8 = (uint)(iVar9 != 0x1000012) * 2 + -1;
    goto switchD_0042d797_caseD_1000012;
  case 0x1000013:
  case 0x1000015:
    break;
  default:
    if (1 < iVar9 + 0xfefffffcU) {
      if (iVar9 == 0x1000002) goto switchD_0042d797_caseD_1000014;
      if (iVar9 == 0x1000001) goto switchD_0042d797_caseD_1000012;
      if (iVar9 != 0x20) goto LAB_0042d895;
    }
  }
switchD_0042d797_caseD_1000013:
  pQVar10 = QWidget::style(&this->super_QWidget);
  iVar8 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x12,0,this,0);
  if (iVar8 == 0) goto LAB_0042d895;
  this_00 = &this_01->currentAction;
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (!bVar4) goto LAB_0042d895;
  pQVar11 = QAction::menu<QMenu*>((QAction *)(this_01->currentAction).wp.value);
  if (pQVar11 == (QMenu *)0x0) {
    QVar16 = (QKeyEvent)0x1;
    if ((iVar9 + 0xfefffffcU < 2) || (iVar9 == 0x20)) {
      pDVar2 = (this_00->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        pQVar17 = (QObject *)0x0;
      }
      else {
        pQVar17 = (this_01->currentAction).wp.value;
      }
      action = (QObject *)0x0;
      QMenuBarPrivate::activateAction(this_01,(QAction *)pQVar17,Trigger);
      pDVar2 = (this_01->currentAction).wp.d;
      if (pDVar2 != (Data *)0x0) {
        if (*(int *)(pDVar2 + 4) == 0) {
          action = (QObject *)0x0;
        }
        else {
          action = (this_01->currentAction).wp.value;
        }
      }
      QMenuBarPrivate::setCurrentAction(this_01,(QAction *)action,false,false);
      QMenuBarPrivate::setKeyboardMode(this_01,false);
    }
    goto LAB_0042daf2;
  }
  pDVar2 = (this_00->wp).d;
  if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
    pQVar17 = (QObject *)0x0;
  }
  else {
    pQVar17 = (this_01->currentAction).wp.value;
  }
  QMenuBarPrivate::popupAction(this_01,(QAction *)pQVar17,true);
  goto LAB_0042daef;
switchD_0042d797_caseD_1000014:
  iVar8 = -1;
switchD_0042d797_caseD_1000012:
  bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_01->currentAction);
  if (bVar4) {
    qVar13 = QtPrivate::indexOf<QAction*,QPointer<QAction>>
                       (&(this_01->super_QWidgetPrivate).actions,&this_01->currentAction,0);
    local_88 = QMenuBarPrivate::getNextAction(this_01,(int)qVar13,iVar8);
    if (local_88 == (QAction *)0x0) goto LAB_0042d895;
    bVar4 = (bool)(this_01->field_0x2a0 & 1);
LAB_0042d812:
    QMenuBarPrivate::setCurrentAction(this_01,local_88,bVar4,true);
  }
  else {
LAB_0042d895:
    cVar5 = QKeyEvent::matches((StandardKey)e);
    if (cVar5 == '\0') {
      iVar9 = QKeyEvent::modifiers();
      if ((iVar9 == 0) || (uVar12 = QKeyEvent::modifiers(), (uVar12 & 0x18000000) != 0)) {
        local_58.d = *(Data **)(e + 0x28);
        local_58.ptr = *(char16_t **)(e + 0x30);
        local_58.size = *(qsizetype *)(e + 0x38);
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if ((undefined1 *)local_58.size == (undefined1 *)0x1) {
          bVar1 = this_01->field_0x2a0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          if ((bVar1 & 1) == 0) {
            local_58.d = *(Data **)(e + 0x28);
            local_58.ptr = *(char16_t **)(e + 0x30);
            local_58.size = *(qsizetype *)(e + 0x38);
            if (local_58.d != (Data *)0x0) {
              LOCK();
              ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            cVar6 = QChar::toUpper((uint)(ushort)*local_58.ptr);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
            lVar19 = 0;
            local_8c = 0;
            local_88 = (QAction *)0x0;
            local_80 = (QAction *)0x0;
            local_78 = (QAction *)0x0;
            for (uVar12 = 0; uVar12 < (ulong)(this_01->super_QWidgetPrivate).actions.d.size;
                uVar12 = uVar12 + 1) {
              bVar4 = QRect::isNull((QRect *)((long)&(((this_01->actionRects).d.ptr)->x1).m_i +
                                             lVar19));
              if (!bVar4) {
                pQVar18 = (this_01->super_QWidgetPrivate).actions.d.ptr[uVar12];
                local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QAction::text();
                pQVar3 = local_80;
                if (((undefined1 *)local_58.size != (undefined1 *)0x0) &&
                   (qVar13 = QString::indexOf((QString *)&local_58,(QChar)0x26,0,CaseSensitive),
                   -1 < qVar13)) {
                  pQVar14 = QString::data((QString *)&local_58);
                  QVar7 = QChar::toUpper(pQVar14 + qVar13 + 1);
                  if (QVar7.ucs == cVar6) {
                    if (local_88 == (QAction *)0x0) {
                      local_88 = pQVar18;
                    }
                    pDVar2 = (this_01->currentAction).wp.d;
                    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
                      pQVar15 = (QAction *)0x0;
                    }
                    else {
                      pQVar15 = (QAction *)(this_01->currentAction).wp.value;
                    }
                    local_8c = local_8c + 1;
                    pQVar3 = pQVar18;
                    if (pQVar15 != pQVar18) {
                      if (local_80 == (QAction *)0x0) {
                        pQVar18 = local_78;
                      }
                      pQVar3 = local_80;
                      if (local_78 == (QAction *)0x0) {
                        local_78 = pQVar18;
                      }
                    }
                  }
                }
                local_80 = pQVar3;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              }
              lVar19 = lVar19 + 0x10;
            }
            if (local_8c < 1) {
              QVar16 = (QKeyEvent)0x0;
              goto LAB_0042daf2;
            }
            if ((local_8c != 1) &&
               (bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this_01->currentAction), bVar4)
               ) {
              if (local_78 != (QAction *)0x0) {
                local_88 = local_78;
              }
              if (local_80 == (QAction *)0x0) {
                local_88 = local_78;
              }
            }
            if (local_88 != (QAction *)0x0) {
              bVar4 = true;
              goto LAB_0042d812;
            }
          }
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        }
      }
      QVar16 = (QKeyEvent)0x0;
      goto LAB_0042daf2;
    }
    QMenuBarPrivate::setCurrentAction(this_01,(QAction *)0x0,false,false);
    QMenuBarPrivate::setKeyboardMode(this_01,false);
  }
LAB_0042daef:
  QVar16 = (QKeyEvent)0x1;
LAB_0042daf2:
  e[0xc] = QVar16;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBar::keyPressEvent(QKeyEvent *e)
{
    Q_D(QMenuBar);
    d->updateGeometries();
    int key = e->key();
    if (isRightToLeft()) {  // in reverse mode open/close key for submenues are reversed
        if (key == Qt::Key_Left)
            key = Qt::Key_Right;
        else if (key == Qt::Key_Right)
            key = Qt::Key_Left;
    }
    if (key == Qt::Key_Tab) //means right
        key = Qt::Key_Right;
    else if (key == Qt::Key_Backtab) //means left
        key = Qt::Key_Left;

    bool key_consumed = false;
    switch(key) {
    case Qt::Key_Up:
    case Qt::Key_Down:
    case Qt::Key_Enter:
    case Qt::Key_Space:
    case Qt::Key_Return: {
        if (!style()->styleHint(QStyle::SH_MenuBar_AltKeyNavigation, nullptr, this) || !d->currentAction)
           break;
        if (d->currentAction->menu()) {
            d->popupAction(d->currentAction, true);
        } else if (key == Qt::Key_Enter || key == Qt::Key_Return || key == Qt::Key_Space) {
            d->activateAction(d->currentAction, QAction::Trigger);
            d->setCurrentAction(d->currentAction, false);
            d->setKeyboardMode(false);
        }
        key_consumed = true;
        break; }

    case Qt::Key_Right:
    case Qt::Key_Left: {
        if (d->currentAction) {
            int index = d->actions.indexOf(d->currentAction);
            if (QAction *nextAction = d->getNextAction(index, key == Qt::Key_Left ? -1 : +1)) {
                d->setCurrentAction(nextAction, d->popupState, true);
                key_consumed = true;
            }
        }
        break; }

    default:
        key_consumed = false;
    }

#ifndef QT_NO_SHORTCUT
    if (!key_consumed && e->matches(QKeySequence::Cancel)) {
        d->setCurrentAction(nullptr);
        d->setKeyboardMode(false);
        key_consumed = true;
    }
#endif

    if (!key_consumed &&
       (!e->modifiers() ||
        (e->modifiers()&(Qt::MetaModifier|Qt::AltModifier))) && e->text().size()==1 && !d->popupState) {
        int clashCount = 0;
        QAction *first = nullptr, *currentSelected = nullptr, *firstAfterCurrent = nullptr;
        {
            const QChar c = e->text().at(0).toUpper();
            for(int i = 0; i < d->actions.size(); ++i) {
                if (d->actionRects.at(i).isNull())
                    continue;
                QAction *act = d->actions.at(i);
                QString s = act->text();
                if (!s.isEmpty()) {
                    qsizetype ampersand = s.indexOf(u'&');
                    if (ampersand >= 0) {
                        if (s[ampersand+1].toUpper() == c) {
                            clashCount++;
                            if (!first)
                                first = act;
                            if (act == d->currentAction)
                                currentSelected = act;
                            else if (!firstAfterCurrent && currentSelected)
                                firstAfterCurrent = act;
                        }
                    }
                }
            }
        }
        QAction *next_action = nullptr;
        if (clashCount >= 1) {
            if (clashCount == 1 || !d->currentAction || (currentSelected && !firstAfterCurrent))
                next_action = first;
            else
                next_action = firstAfterCurrent;
        }
        if (next_action) {
            key_consumed = true;
            d->setCurrentAction(next_action, true, true);
        }
    }
    if (key_consumed)
        e->accept();
    else
        e->ignore();
}